

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtreewidget.cpp
# Opt level: O3

void QTreeWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  undefined4 uVar3;
  long lVar4;
  ScrollHint hint;
  int iVar5;
  QTreeWidgetItem *item;
  long in_FS_OFFSET;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  undefined8 uStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        itemPressed((QTreeWidget *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        itemClicked((QTreeWidget *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        itemDoubleClicked((QTreeWidget *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        itemActivated((QTreeWidget *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        itemEntered((QTreeWidget *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        itemChanged((QTreeWidget *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 6:
      local_30 = *_a[1];
      iVar5 = 6;
      goto LAB_005b5736;
    case 7:
      local_30 = *_a[1];
      iVar5 = 7;
LAB_005b5736:
      local_20 = &local_30;
      local_28 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_28);
      goto switchD_005b53ce_caseD_3;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        currentItemChanged((QTreeWidget *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QMetaObject::activate(_o,&staticMetaObject,9,(void **)0x0);
        return;
      }
      break;
    case 10:
      item = *_a[1];
      hint = *_a[2];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
LAB_005b5761:
        scrollToItem((QTreeWidget *)_o,item,hint);
        return;
      }
      break;
    case 0xb:
      item = *_a[1];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        hint = EnsureVisible;
        goto LAB_005b5761;
      }
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        expandItem((QTreeWidget *)_o,*_a[1]);
        return;
      }
      break;
    case 0xd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        collapseItem((QTreeWidget *)_o,*_a[1]);
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        clear((QTreeWidget *)_o);
        return;
      }
      break;
    default:
      goto switchD_005b53ce_caseD_3;
    }
    goto LAB_005b5829;
  case ReadProperty:
    puVar1 = (undefined4 *)*_a;
    if (_id == 1) {
      lVar4 = QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
      uVar3 = *(undefined4 *)(*(long *)(lVar4 + 0x10) + 0x50);
    }
    else {
      if (_id != 0) break;
      local_28 = (void *)0xffffffffffffffff;
      local_20 = (undefined8 *)0x0;
      uStack_18 = 0;
      uVar3 = (**(code **)(**(long **)(*(long *)(_o + 8) + 0x2f8) + 0x80))();
    }
    *puVar1 = uVar3;
    break;
  case WriteProperty:
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setColumnCount((QTreeWidget *)_o,**_a);
        return;
      }
      goto LAB_005b5829;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == itemPressed && lVar4 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == itemClicked && lVar4 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == itemDoubleClicked && lVar4 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == itemActivated && lVar4 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar2 == itemEntered && lVar4 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar2 == itemChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar2 == itemExpanded && lVar4 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (pcVar2 == itemCollapsed && lVar4 == 0) {
      *(undefined4 *)*_a = 7;
    }
    else if (pcVar2 == currentItemChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 8;
    }
    else if (pcVar2 == itemSelectionChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 9;
    }
  }
switchD_005b53ce_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_005b5829:
  __stack_chk_fail();
}

Assistant:

void QTreeWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTreeWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 6: _t->itemExpanded((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1]))); break;
        case 7: _t->itemCollapsed((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1]))); break;
        case 8: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[2]))); break;
        case 9: _t->itemSelectionChanged(); break;
        case 10: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 11: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 12: _t->expandItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 13: _t->collapseItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 14: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * )>(_a, &QTreeWidget::itemExpanded, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * )>(_a, &QTreeWidget::itemCollapsed, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , QTreeWidgetItem * )>(_a, &QTreeWidget::currentItemChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)()>(_a, &QTreeWidget::itemSelectionChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->columnCount(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->topLevelItemCount(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setColumnCount(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}